

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void check_repfnz(int n,int w,int jcol,int *repfnz)

{
  long lVar1;
  undefined1 *puVar2;
  ulong extraout_RDX;
  ulong uVar3;
  undefined1 auStack_108 [264];
  
  puVar2 = auStack_108;
  if (0 < w) {
    lVar1 = (long)jcol;
    do {
      if (0 < n) {
        uVar3 = 0;
        do {
          if (repfnz[uVar3] != -1) {
            check_repfnz_cold_1();
            if ((int)uVar3 < 1) {
              printf("All tests for %3s driver passed the threshold (%6d tests run)\n",lVar1,
                     extraout_RDX & 0xffffffff);
            }
            else {
              printf("%3s driver: %d out of %d tests failed to pass the threshold\n",lVar1);
            }
            if (0 < (int)puVar2) {
              printf("%6d error messages recorded\n",(ulong)puVar2 & 0xffffffff);
              return;
            }
            return;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)n != uVar3);
      }
      lVar1 = lVar1 + 1;
      repfnz = repfnz + n;
    } while (lVar1 < w + jcol);
  }
  return;
}

Assistant:

void check_repfnz(int n, int w, int jcol, const int *repfnz)
{
    int jj, k;

    for (jj = jcol; jj < jcol+w; jj++) 
	for (k = 0; k < n; k++)
	    if ( repfnz[(jj-jcol)*n + k] != SLU_EMPTY ) {
		fprintf(stderr, "col %d, repfnz_col[%d] = %d\n", jj,
			k, repfnz[(jj-jcol)*n + k]);
		ABORT("check_repfnz");
	    }
}